

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O0

void gtk_up_frame(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  FVar1 = fl_color_average(0xff,c,0.5);
  gtk_color(FVar1);
  fl_xyline(x + 2,y + 1,x + w + -3);
  fl_yxline(x + 1,y + 2,y + h + -3);
  FVar1 = fl_color_average(0x38,c,0.5);
  gtk_color(FVar1);
  fl_begin_loop();
  fl_vertex((double)x,(double)(y + 2));
  fl_vertex((double)(x + 2),(double)y);
  fl_vertex((double)(x + w + -3),(double)y);
  fl_vertex((double)(x + w + -1),(double)(y + 2));
  fl_vertex((double)(x + w + -1),(double)(y + h + -3));
  fl_vertex((double)(x + w + -3),(double)(y + h + -1));
  fl_vertex((double)(x + 2),(double)(y + h + -1));
  fl_vertex((double)x,(double)(y + h + -3));
  fl_end_loop();
  return;
}

Assistant:

static void gtk_up_frame(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(fl_color_average(FL_WHITE, c, 0.5));
  fl_xyline(x + 2, y + 1, x + w - 3);
  fl_yxline(x + 1, y + 2, y + h - 3);

  gtk_color(fl_color_average(FL_BLACK, c, 0.5));
  fl_begin_loop();
    fl_vertex(x, y + 2);
    fl_vertex(x + 2, y);
    fl_vertex(x + w - 3, y);
    fl_vertex(x + w - 1, y + 2);
    fl_vertex(x + w - 1, y + h - 3);
    fl_vertex(x + w - 3, y + h - 1);
    fl_vertex(x + 2, y + h - 1);
    fl_vertex(x, y + h - 3);
  fl_end_loop();
}